

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O3

bool __thiscall iDynTree::Visualizer::isWindowActive(Visualizer *this)

{
  return false;
}

Assistant:

bool Visualizer::isWindowActive() const
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        return false;
    }
    return pimpl->m_irrDevice->isWindowActive();
#else
    return false;
#endif
}